

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O3

void __thiscall
cfd::core::TaprootScriptTree::TaprootScriptTree(TaprootScriptTree *this,TapBranch *leaf_branch)

{
  byte bVar1;
  CfdException *pCVar2;
  long lVar3;
  undefined1 local_88 [64];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_48;
  
  TapBranch::TapBranch(&this->super_TapBranch,leaf_branch);
  (this->super_TapBranch)._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (leaf_branch->has_leaf_ == false) {
    local_88._0_8_ = "cfdcore_taproot.cpp";
    local_88._8_4_ = 0x1d8;
    local_88._16_8_ = (long)"CfdInitializeTaprootScriptTree" + 0xd;
    logger::log<>((CfdSourceLocation *)local_88,kCfdLogLevelWarning,"object is not tapleaf.");
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_88._0_8_ = local_88 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"object is not tapleaf.","");
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_88);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar1 = leaf_branch->leaf_version_;
  lVar3 = 0;
  do {
    if (*(uint *)((long)TaprootUtil::IsValidLeafVersion::kValidLeafVersions + lVar3) == (uint)bVar1)
    goto LAB_0035e49d;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x24);
  if (((bVar1 & 1) != 0) || (0x3e < (byte)(bVar1 + 0x40))) {
    local_88._0_8_ = "cfdcore_taproot.cpp";
    local_88._8_4_ = 0x1de;
    local_88._16_8_ = (long)"CfdInitializeTaprootScriptTree" + 0xd;
    local_48.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_48.
                           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,bVar1);
    logger::log<unsigned_char&>
              ((CfdSourceLocation *)local_88,kCfdLogLevelWarning,"Unsupported leaf version. [{}]",
               (uchar *)&local_48);
    pCVar2 = (CfdException *)__cxa_allocate_exception(0x30);
    local_88._0_8_ = local_88 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"Unsupported leaf version.","");
    CfdException::CfdException(pCVar2,kCfdIllegalArgumentError,(string *)local_88);
    __cxa_throw(pCVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
LAB_0035e49d:
  (this->super_TapBranch).has_leaf_ = true;
  (this->super_TapBranch).leaf_version_ = bVar1;
  Script::Script((Script *)local_88,&leaf_branch->script_);
  Script::operator=(&(this->super_TapBranch).script_,(Script *)local_88);
  Script::~Script((Script *)local_88);
  ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::vector
            ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&local_48,
             &leaf_branch->branch_list_);
  local_88._16_8_ =
       (this->super_TapBranch).branch_list_.
       super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->super_TapBranch).branch_list_.
  super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)local_48.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88._0_8_ =
       (this->super_TapBranch).branch_list_.
       super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_88._8_8_ =
       (this->super_TapBranch).branch_list_.
       super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->super_TapBranch).branch_list_.
  super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)local_48.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_start;
  (this->super_TapBranch).branch_list_.
  super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)local_48.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
            ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)local_88);
  ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector
            ((vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)&local_48);
  (*leaf_branch->_vptr_TapBranch[4])(&local_48,leaf_branch);
  local_88._16_8_ =
       (this->nodes_).
       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_88._0_8_ =
       (this->nodes_).
       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_88._8_8_ =
       (this->nodes_).
       super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_48.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->nodes_).super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_48.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_48.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)local_88);
  ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_48)
  ;
  return;
}

Assistant:

TaprootScriptTree::TaprootScriptTree(const TapBranch& leaf_branch)
    : TapBranch(leaf_branch) {
  if (!leaf_branch.HasTapLeaf()) {
    warn(CFD_LOG_SOURCE, "object is not tapleaf.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "object is not tapleaf.");
  }
  if (!TaprootUtil::IsValidLeafVersion(leaf_branch.GetLeafVersion())) {
    warn(
        CFD_LOG_SOURCE, "Unsupported leaf version. [{}]",
        leaf_branch.GetLeafVersion());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unsupported leaf version.");
  }
  has_leaf_ = true;
  leaf_version_ = leaf_branch.GetLeafVersion();
  script_ = leaf_branch.GetScript();
  branch_list_ = leaf_branch.GetBranchList();
  nodes_ = leaf_branch.GetNodeList();
}